

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O3

void testTranslationRotationMatrix<float>(M44d *mat)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float *weights;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> to;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> from;
  M44d m1;
  M44d m2;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> local_248;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> local_228;
  double local_208;
  undefined8 uStack_200;
  double local_1f8;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double dStack_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  Vec3<double> local_198;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  double dStack_140;
  undefined1 local_138 [12];
  undefined4 uStack_12c;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  M44d local_b8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing known translate/rotate matrix:\n ",0x28);
  Imath_2_5::operator<<((ostream *)&std::cout,mat);
  if (testTranslationRotationMatrix<float>(Imath_2_5::Matrix44<double>const&)::rand == '\0') {
    testTranslationRotationMatrix<float>();
  }
  local_228.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Vec3<float> *)0x0;
  local_228.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::reserve
            (&local_228,7);
  local_248.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Vec3<float> *)0x0;
  local_248.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar3 = 7;
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::reserve
            (&local_248,7);
  do {
    local_1f8 = Imath_2_5::erand48(testTranslationRotationMatrix<float>::rand._state);
    local_208 = Imath_2_5::erand48(testTranslationRotationMatrix<float>::rand._state);
    local_1d8 = Imath_2_5::erand48(testTranslationRotationMatrix<float>::rand._state);
    local_168 = mat->x[0][0];
    dStack_160 = mat->x[0][1];
    local_178 = mat->x[1][0];
    dStack_170 = mat->x[1][1];
    local_148 = mat->x[2][0];
    dStack_140 = mat->x[2][1];
    local_1e8 = mat->x[3][0];
    dStack_1e0 = mat->x[3][1];
    local_1b8 = mat->x[0][2];
    local_1c8 = mat->x[1][2];
    local_1c0 = mat->x[2][2];
    dVar8 = mat->x[3][2];
    local_1a0 = mat->x[0][3];
    local_1b0 = mat->x[1][3];
    local_1a8 = mat->x[2][3];
    local_158 = mat->x[3][3];
    uStack_150 = 0;
    local_138._0_8_ = CONCAT44((float)local_208,(float)local_1f8);
    local_138._8_4_ = (undefined4)local_1d8;
    std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
    emplace_back<Imath_2_5::Vec3<float>>
              ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&local_228,
               (Vec3<float> *)local_138);
    auVar9._0_8_ = local_158 + local_1a8 * local_1d8 + local_1a0 * local_1f8 + local_1b0 * local_208
    ;
    auVar5._0_8_ = local_1e8 + local_1d8 * local_148 + local_1f8 * local_168 + local_208 * local_178
    ;
    auVar5._8_8_ = dStack_1e0 +
                   local_1d8 * dStack_140 + local_1f8 * dStack_160 + local_208 * dStack_170;
    auVar9._8_8_ = auVar9._0_8_;
    auVar5 = divpd(auVar5,auVar9);
    local_138._0_8_ = CONCAT44((float)auVar5._8_8_,(float)auVar5._0_8_);
    local_138._8_4_ =
         (undefined4)
         ((dVar8 + local_1c0 * local_1d8 + local_1b8 * local_1f8 + local_1c8 * local_208) /
         auVar9._0_8_);
    std::vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>>::
    emplace_back<Imath_2_5::Vec3<float>>
              ((vector<Imath_2_5::Vec3<float>,std::allocator<Imath_2_5::Vec3<float>>> *)&local_248,
               (Vec3<float> *)local_138);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  weights = (float *)operator_new(0x1c);
  auVar6 = _DAT_00165860;
  auVar9 = _DAT_00165850;
  auVar5 = _DAT_0015e200;
  lVar3 = 0;
  do {
    auVar11._8_4_ = (int)lVar3;
    auVar11._0_8_ = lVar3;
    auVar11._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar12 = (auVar11 | auVar6) ^ auVar5;
    if (auVar12._4_4_ == -0x80000000 && auVar12._0_4_ < -0x7ffffff9) {
      weights[lVar3] = 1.0;
      weights[lVar3 + 1] = 1.0;
    }
    auVar11 = (auVar11 | auVar9) ^ auVar5;
    if (auVar11._4_4_ == -0x80000000 && auVar11._0_4_ < -0x7ffffff9) {
      weights[lVar3 + 2] = 1.0;
      weights[lVar3 + 3] = 1.0;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  Imath_2_5::procrustesRotationAndTranslation<float>
            ((M44d *)local_138,
             local_228.
             super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_248.
             super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start,weights,7,false);
  Imath_2_5::procrustesRotationAndTranslation<float>
            (&local_b8,
             local_228.
             super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             local_248.
             super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start,7,false);
  lVar3 = 8;
  while( true ) {
    dVar7 = (double)*(float *)((long)local_228.
                                     super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8);
    dVar10 = (double)*(float *)((long)local_228.
                                      super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar3 + -4);
    dVar8 = (double)*(float *)((long)&(local_228.
                                       super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar3);
    local_1f8 = (double)*(float *)((long)&(local_248.
                                           super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->x + lVar3);
    dVar13 = dStack_e0 * dVar8 + dStack_120 * dVar7 + dStack_100 * dVar10 + dStack_c0;
    auVar12._8_8_ = dVar13;
    auVar12._0_8_ = dVar13;
    uVar1 = *(undefined8 *)
             ((long)local_248.
                    super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8);
    local_1d8 = (double)(float)uVar1;
    dStack_1d0 = (double)(float)((ulong)uVar1 >> 0x20);
    local_1e8 = local_b8.x[2][0] * dVar8 + local_b8.x[0][0] * dVar7 + local_b8.x[1][0] * dVar10 +
                local_b8.x[3][0];
    dStack_1e0 = local_b8.x[2][1] * dVar8 + local_b8.x[0][1] * dVar7 + local_b8.x[1][1] * dVar10 +
                 local_b8.x[3][1];
    dVar14 = local_b8.x[2][2] * dVar8 + local_b8.x[0][2] * dVar7 + local_b8.x[1][2] * dVar10 +
             local_b8.x[3][2];
    local_208 = dVar8 * local_b8.x[2][3] + dVar7 * local_b8.x[0][3] + dVar10 * local_b8.x[1][3] +
                local_b8.x[3][3];
    uStack_200 = 0;
    local_198.z = local_1f8 -
                  (local_e8 * dVar8 + local_128 * dVar7 + local_108 * dVar10 + local_c8) / dVar13;
    auVar6._0_8_ = dVar8 * local_f8 + dVar7 * (double)local_138._0_8_ + dVar10 * local_118 +
                   local_d8;
    auVar6._8_8_ = dVar8 * dStack_f0 +
                   dVar7 * (double)CONCAT44(uStack_12c,local_138._8_4_) + dVar10 * dStack_110 +
                   dStack_d0;
    auVar5 = divpd(auVar6,auVar12);
    local_198.x = local_1d8 - auVar5._0_8_;
    local_198.y = dStack_1d0 - auVar5._8_8_;
    dVar8 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (4.450147717014403e-308 <= dVar8) {
      dVar8 = SQRT(dVar8);
    }
    else {
      dVar8 = Imath_2_5::Vec3<double>::lengthTiny(&local_198);
    }
    if (9.999999747378752e-05 <= dVar8) {
      __assert_fail("(b - b1).length() < eps",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                    ,0x53,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = float]")
      ;
    }
    auVar4._8_8_ = local_208;
    auVar4._0_8_ = local_208;
    auVar2._8_8_ = dStack_1e0;
    auVar2._0_8_ = local_1e8;
    auVar5 = divpd(auVar2,auVar4);
    local_198.x = local_1d8 - auVar5._0_8_;
    local_198.y = dStack_1d0 - auVar5._8_8_;
    local_198.z = local_1f8 - dVar14 / local_208;
    dVar8 = local_198.z * local_198.z + local_198.x * local_198.x + local_198.y * local_198.y;
    if (4.450147717014403e-308 <= dVar8) {
      dVar8 = SQRT(dVar8);
    }
    else {
      dVar8 = Imath_2_5::Vec3<double>::lengthTiny(&local_198);
    }
    if (9.999999747378752e-05 <= dVar8) break;
    lVar3 = lVar3 + 0xc;
    if (lVar3 == 0x5c) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  OK\n",5);
      operator_delete(weights,0x1c);
      if (local_248.
          super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (Vec3<float> *)0x0) {
        operator_delete(local_248.
                        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.
          super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (Vec3<float> *)0x0) {
        operator_delete(local_228.
                        super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  __assert_fail("(b - b2).length() < eps",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                ,0x54,"void testTranslationRotationMatrix(const Imath_2_5::M44d &) [T = float]");
}

Assistant:

void
testTranslationRotationMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& mat)
{
    std::cout << "Testing known translate/rotate matrix:\n " << mat;
    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> Vec;

    static IMATH_INTERNAL_NAMESPACE::Rand48 rand (2047);

    size_t numPoints = 7;
    std::vector<Vec> from;  from.reserve (numPoints);
    std::vector<Vec> to;    to.reserve (numPoints);
    for (size_t i = 0; i < numPoints; ++i)
    {
        IMATH_INTERNAL_NAMESPACE::V3d a (rand.nextf(), rand.nextf(), rand.nextf());
        IMATH_INTERNAL_NAMESPACE::V3d b = a * mat;

        from.push_back (Vec(a));
        to.push_back (Vec(b));
    }

    std::vector<T> weights (numPoints, T(1));
    const IMATH_INTERNAL_NAMESPACE::M44d m1 = procrustesRotationAndTranslation (&from[0], &to[0], &weights[0], numPoints);
    const IMATH_INTERNAL_NAMESPACE::M44d m2 = procrustesRotationAndTranslation (&from[0], &to[0], numPoints);

    const T eps = sizeof(T) == 8 ? 1e-8 : 1e-4;
    for (size_t i = 0; i < numPoints; ++i)
    {
        const IMATH_INTERNAL_NAMESPACE::V3d a = from[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b = to[i];
        const IMATH_INTERNAL_NAMESPACE::V3d b1 = a * m1;
        const IMATH_INTERNAL_NAMESPACE::V3d b2 = a * m2;

        assert ((b - b1).length() < eps);
        assert ((b - b2).length() < eps);
    }
    std::cout << "  OK\n";
}